

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::RenderDeviceGLImpl::FlagSupportedTexFormats(RenderDeviceGLImpl *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  initializer_list<const_char_*> __l;
  initializer_list<const_char_*> __l_00;
  initializer_list<const_char_*> __l_01;
  initializer_list<const_char_*> __l_02;
  initializer_list<const_char_*> __l_03;
  undefined *puVar4;
  PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC p_Var5;
  GLenum GVar6;
  undefined4 uVar7;
  bool bVar8;
  BIND_FLAGS BVar9;
  BIND_FLAGS BVar10;
  GLuint GVar11;
  int iVar12;
  Version *pVVar13;
  vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  *this_00;
  reference this_01;
  Char *pCVar14;
  ulong uVar15;
  TextureFormatAttribs *pTVar16;
  undefined8 uVar17;
  NativePixelAttribs NVar18;
  char (*in_stack_fffffffffffffb38) [106];
  bool local_439;
  bool local_39e;
  bool local_39d;
  bool local_39c;
  bool local_39b;
  bool local_39a;
  bool local_399;
  bool local_381;
  undefined1 local_380 [8];
  string _msg_1;
  string _msg;
  int BlockBytesInRow;
  TextureFormatAttribs *FmtAttribs;
  undefined8 local_31c;
  undefined1 local_314;
  undefined8 *local_310;
  NativePixelAttribs *TransferAttribs;
  string msg_3;
  GLTextureCreateReleaseHelper local_2e0;
  GLenum err_1;
  GLTextureObj TestGLTex;
  string msg_2;
  string msg_1;
  GLenum err;
  GLint params;
  string msg;
  GLenum GLFmt;
  TextureFormatInfoExt *FmtInfo;
  iterator __end1;
  iterator __begin1;
  vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  *__range1;
  undefined1 local_238 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> ZeroData;
  char local_218 [4];
  int MaxTexelSize;
  int TestTextureDim;
  bool local_209;
  anon_class_8_1_8991fb9c aStack_208;
  bool bGL43OrAbove;
  anon_class_8_1_8991fb9c FlagFormat;
  undefined1 auStack_1f8 [4];
  BIND_FLAGS BindSrvRtvUav;
  pointer ppcStack_1f0;
  pointer local_1e8;
  Version local_1d8;
  Version local_1d0;
  BIND_FLAGS local_1c8;
  allocator<const_char_*> local_1c1;
  BIND_FLAGS R11G11B10FBindFlags;
  iterator local_1b8;
  size_type local_1b0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1a8;
  Version local_190;
  Version local_188;
  BIND_FLAGS local_180;
  allocator<const_char_*> local_179;
  BIND_FLAGS F32BindFlags;
  iterator local_170;
  size_type local_168;
  vector<const_char_*,_std::allocator<const_char_*>_> local_160;
  Version local_148;
  Version local_140;
  BIND_FLAGS local_138;
  BIND_FLAGS local_134;
  BIND_FLAGS F16BindFlags;
  BIND_FLAGS SI32BindFlags;
  BIND_FLAGS UI32BindFlags;
  BIND_FLAGS SI16BindFlags;
  BIND_FLAGS UI16BindFlags;
  iterator local_118;
  size_type local_110;
  vector<const_char_*,_std::allocator<const_char_*>_> local_108;
  Version local_f0;
  BIND_FLAGS local_e8;
  allocator<const_char_*> local_e1;
  BIND_FLAGS S16BindFlags;
  iterator local_d8;
  size_type local_d0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_c8;
  Version local_b0;
  BIND_FLAGS local_a8;
  BIND_FLAGS local_a4;
  BIND_FLAGS U16BindFlags;
  BIND_FLAGS SI8BindFlags;
  BIND_FLAGS UI8BindFlags;
  allocator<const_char_*> local_89;
  char *local_88;
  iterator local_80;
  size_type local_78;
  vector<const_char_*,_std::allocator<const_char_*>_> local_70;
  Version local_58;
  BIND_FLAGS local_50;
  BIND_FLAGS local_4c;
  BIND_FLAGS S8BindFlags;
  BIND_FLAGS SRGBA8BindFlags;
  BIND_FLAGS U8BindFlags;
  BIND_FLAGS TexBindFlags;
  anon_class_16_2_af03feb3 CheckBindFlagSupport;
  bool bETC2;
  bool bTexSwizzle;
  bool bTexNorm16;
  bool bS3TC;
  bool bBPTC;
  bool bRGTC;
  bool local_1a;
  byte local_19;
  bool bGLES30OrAbove;
  RenderDeviceInfo *pRStack_18;
  bool bDekstopGL;
  RenderDeviceInfo *DeviceInfo;
  RenderDeviceGLImpl *this_local;
  
  DeviceInfo = (RenderDeviceInfo *)this;
  pRStack_18 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetDeviceInfo
                         (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
  local_19 = pRStack_18->Type == RENDER_DEVICE_TYPE_GL;
  local_381 = false;
  if (pRStack_18->Type == RENDER_DEVICE_TYPE_GLES) {
    pVVar13 = &pRStack_18->APIVersion;
    Version::Version((Version *)&stack0xffffffffffffffdc,3,0);
    local_381 = Version::operator>=(pVVar13,(Version *)&stack0xffffffffffffffdc);
  }
  local_1a = local_381;
  bVar8 = CheckExtension(this,"GL_EXT_texture_compression_rgtc");
  local_399 = true;
  if (!bVar8) {
    local_399 = CheckExtension(this,"GL_ARB_texture_compression_rgtc");
  }
  bVar8 = CheckExtension(this,"GL_EXT_texture_compression_bptc");
  local_39a = true;
  if (!bVar8) {
    local_39a = CheckExtension(this,"GL_ARB_texture_compression_bptc");
  }
  bVar8 = CheckExtension(this,"GL_EXT_texture_compression_s3tc");
  local_39b = true;
  if (!bVar8) {
    local_39b = CheckExtension(this,"GL_WEBGL_compressed_texture_s3tc");
  }
  local_39c = true;
  if ((local_19 & 1) == 0) {
    local_39c = CheckExtension(this,"GL_EXT_texture_norm16");
  }
  local_39d = true;
  if (((local_19 & 1) == 0) && (local_39d = true, (local_1a & 1U) == 0)) {
    local_39d = CheckExtension(this,"GL_ARB_texture_swizzle");
  }
  CheckBindFlagSupport.this._7_1_ = local_39d;
  local_39e = true;
  if ((local_1a & 1U) == 0) {
    local_39e = CheckExtension(this,"GL_ARB_ES3_compatibility");
  }
  CheckBindFlagSupport.this._6_1_ = local_39e;
  _U8BindFlags = pRStack_18;
  CheckBindFlagSupport.DeviceInfo = (RenderDeviceInfo *)this;
  SRGBA8BindFlags =
       Diligent::operator|(BIND_SHADER_RESOURCE,
                           (uint)((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
                                  m_DeviceInfo.Features.PixelUAVWritesAndAtomics !=
                                 DEVICE_FEATURE_STATE_DISABLED) << 7);
  S8BindFlags = Diligent::operator|(SRGBA8BindFlags,BIND_RENDER_TARGET);
  local_4c = Diligent::operator|(SRGBA8BindFlags,BIND_RENDER_TARGET);
  BVar10 = SRGBA8BindFlags;
  Version::Version(&local_58,4,4);
  local_88 = "GL_EXT_render_snorm";
  local_80 = &local_88;
  local_78 = 1;
  std::allocator<const_char_*>::allocator(&local_89);
  __l_03._M_len = local_78;
  __l_03._M_array = local_80;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_70,__l_03,&local_89);
  BVar9 = FlagSupportedTexFormats::anon_class_16_2_af03feb3::operator()
                    ((anon_class_16_2_af03feb3 *)&U8BindFlags,BIND_RENDER_TARGET,&local_58,
                     &FlagSupportedTexFormats::NotAvaiable,&local_70);
  BVar10 = Diligent::operator|(BVar10,BVar9);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_70);
  std::allocator<const_char_*>::~allocator(&local_89);
  local_50 = BVar10;
  U16BindFlags = Diligent::operator|(SRGBA8BindFlags,BIND_RENDER_TARGET);
  local_a4 = Diligent::operator|(SRGBA8BindFlags,BIND_RENDER_TARGET);
  BVar10 = SRGBA8BindFlags;
  Version::Version(&local_b0,4,0);
  _S16BindFlags = "GL_EXT_texture_norm16";
  local_d8 = (iterator)&S16BindFlags;
  local_d0 = 1;
  std::allocator<const_char_*>::allocator(&local_e1);
  __l_02._M_len = local_d0;
  __l_02._M_array = local_d8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_c8,__l_02,&local_e1);
  BVar9 = FlagSupportedTexFormats::anon_class_16_2_af03feb3::operator()
                    ((anon_class_16_2_af03feb3 *)&U8BindFlags,BIND_RENDER_TARGET,&local_b0,
                     &FlagSupportedTexFormats::NotAvaiable,&local_c8);
  BVar9 = Diligent::operator|(BVar10,BVar9);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_c8);
  std::allocator<const_char_*>::~allocator(&local_e1);
  BVar10 = SRGBA8BindFlags;
  local_a8 = BVar9;
  Version::Version(&local_f0,4,4);
  _UI16BindFlags = "GL_EXT_render_snorm";
  local_118 = (iterator)&UI16BindFlags;
  local_110 = 1;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)((long)&SI16BindFlags + 3));
  __l_01._M_len = local_110;
  __l_01._M_array = local_118;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_108,__l_01,(allocator<const_char_*> *)((long)&SI16BindFlags + 3));
  BVar9 = FlagSupportedTexFormats::anon_class_16_2_af03feb3::operator()
                    ((anon_class_16_2_af03feb3 *)&U8BindFlags,BIND_RENDER_TARGET,&local_f0,
                     &FlagSupportedTexFormats::NotAvaiable,&local_108);
  BVar10 = Diligent::operator|(BVar10,BVar9);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_108);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)((long)&SI16BindFlags + 3));
  local_e8 = BVar10;
  UI32BindFlags = Diligent::operator|(SRGBA8BindFlags,BIND_RENDER_TARGET);
  SI32BindFlags = Diligent::operator|(SRGBA8BindFlags,BIND_RENDER_TARGET);
  F16BindFlags = Diligent::operator|(SRGBA8BindFlags,BIND_RENDER_TARGET);
  local_134 = Diligent::operator|(SRGBA8BindFlags,BIND_RENDER_TARGET);
  BVar10 = SRGBA8BindFlags;
  Version::Version(&local_140,4,0);
  Version::Version(&local_148,3,2);
  _F32BindFlags = "GL_EXT_color_buffer_half_float";
  local_170 = (iterator)&F32BindFlags;
  local_168 = 1;
  std::allocator<const_char_*>::allocator(&local_179);
  __l_00._M_len = local_168;
  __l_00._M_array = local_170;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_160,__l_00,&local_179);
  BVar9 = FlagSupportedTexFormats::anon_class_16_2_af03feb3::operator()
                    ((anon_class_16_2_af03feb3 *)&U8BindFlags,BIND_RENDER_TARGET,&local_140,
                     &local_148,&local_160);
  BVar9 = Diligent::operator|(BVar10,BVar9);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_160);
  std::allocator<const_char_*>::~allocator(&local_179);
  BVar10 = SRGBA8BindFlags;
  local_138 = BVar9;
  Version::Version(&local_188,4,0);
  Version::Version(&local_190,3,2);
  _R11G11B10FBindFlags = "GL_EXT_color_buffer_float";
  local_1b8 = (iterator)&R11G11B10FBindFlags;
  local_1b0 = 1;
  std::allocator<const_char_*>::allocator(&local_1c1);
  __l._M_len = local_1b0;
  __l._M_array = local_1b8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_1a8,__l,&local_1c1);
  BVar9 = FlagSupportedTexFormats::anon_class_16_2_af03feb3::operator()
                    ((anon_class_16_2_af03feb3 *)&U8BindFlags,BIND_RENDER_TARGET,&local_188,
                     &local_190,&local_1a8);
  BVar9 = Diligent::operator|(BVar10,BVar9);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_1a8);
  std::allocator<const_char_*>::~allocator(&local_1c1);
  BVar10 = SRGBA8BindFlags;
  local_180 = BVar9;
  Version::Version(&local_1d0,4,0);
  Version::Version(&local_1d8,3,2);
  _auStack_1f8 = (pointer)0x0;
  ppcStack_1f0 = (pointer)0x0;
  local_1e8 = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)auStack_1f8);
  BVar9 = FlagSupportedTexFormats::anon_class_16_2_af03feb3::operator()
                    ((anon_class_16_2_af03feb3 *)&U8BindFlags,BIND_RENDER_TARGET,&local_1d0,
                     &local_1d8,(vector<const_char_*,_std::allocator<const_char_*>_> *)auStack_1f8);
  BVar10 = Diligent::operator|(BVar10,BVar9);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)auStack_1f8);
  local_1c8 = BVar10;
  FlagFormat.this._4_4_ = Diligent::operator|(SRGBA8BindFlags,BIND_RENDER_TARGET);
  aStack_208.this = this;
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA32_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA32_FLOAT,true,local_180,(bool)(local_19 & 1));
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA32_UINT,true,F16BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA32_SINT,true,local_134,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGB32_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGB32_FLOAT,true,local_180,(bool)(local_19 & 1));
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGB32_SINT,true,local_134,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGB32_UINT,true,F16BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA16_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA16_FLOAT,true,local_138,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA16_UNORM,local_39c,local_a8,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA16_UINT,true,UI32BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA16_SNORM,local_39c,local_e8,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA16_SINT,true,SI32BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG32_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG32_FLOAT,true,local_180,(bool)(local_19 & 1));
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG32_SINT,true,local_134,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG32_UINT,true,F16BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R32G8X24_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_D32_FLOAT_S8X24_UINT,true,BIND_DEPTH_STENCIL,false)
  ;
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS,true,SRGBA8BindFlags,
             (bool)(local_19 & 1));
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_X32_TYPELESS_G8X24_UINT,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGB10A2_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGB10A2_UNORM,true,FlagFormat.this._4_4_,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGB10A2_UINT,true,FlagFormat.this._4_4_,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R11G11B10_FLOAT,true,local_1c8,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA8_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA8_UNORM,true,S8BindFlags,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA8_UNORM_SRGB,true,local_4c,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA8_UINT,true,U16BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA8_SNORM,true,local_50,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGBA8_SINT,true,local_a4,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG16_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG16_FLOAT,true,local_138,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG16_UNORM,local_39c,local_a8,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG16_UINT,true,UI32BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG16_SNORM,local_39c,local_e8,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG16_SINT,true,SI32BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R32_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_D32_FLOAT,true,BIND_DEPTH_STENCIL,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R32_FLOAT,true,local_180,(bool)(local_19 & 1));
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R32_UINT,true,F16BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R32_SINT,true,local_134,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R24G8_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_D24_UNORM_S8_UINT,true,BIND_DEPTH_STENCIL,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R24_UNORM_X8_TYPELESS,true,SRGBA8BindFlags,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_X24_TYPELESS_G8_UINT,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG8_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG8_UNORM,true,S8BindFlags,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG8_UINT,true,U16BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG8_SNORM,true,local_50,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG8_SINT,true,local_a4,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R16_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R16_FLOAT,true,local_138,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_D16_UNORM,true,BIND_DEPTH_STENCIL,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R16_UNORM,local_39c,local_a8,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R16_UINT,true,UI32BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R16_SNORM,local_39c,local_e8,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R16_SINT,true,SI32BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R8_TYPELESS,true,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R8_UNORM,true,S8BindFlags,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R8_UINT,true,U16BindFlags,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R8_SNORM,true,local_50,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R8_SINT,true,local_a4,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_A8_UNORM,
             (bool)(CheckBindFlagSupport.this._7_1_ & 1),S8BindFlags,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R1_UNORM,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RGB9E5_SHAREDEXP,true,BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_RG8_B8G8_UNORM,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_G8R8_G8B8_UNORM,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC1_TYPELESS,local_39b,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC1_UNORM,local_39b,BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC1_UNORM_SRGB,local_39b,BIND_SHADER_RESOURCE,true)
  ;
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC2_TYPELESS,local_39b,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC2_UNORM,local_39b,BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC2_UNORM_SRGB,local_39b,BIND_SHADER_RESOURCE,true)
  ;
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC3_TYPELESS,local_39b,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC3_UNORM,local_39b,BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC3_UNORM_SRGB,local_39b,BIND_SHADER_RESOURCE,true)
  ;
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC4_TYPELESS,local_399,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC4_UNORM,local_399,BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC4_SNORM,local_399,BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC5_TYPELESS,local_399,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC5_UNORM,local_399,BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC5_SNORM,local_399,BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_B5G6R5_UNORM,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_B5G5R5A1_UNORM,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BGRA8_UNORM,
             (bool)(CheckBindFlagSupport.this._7_1_ & 1),BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BGRX8_UNORM,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BGRA8_TYPELESS,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BGRA8_UNORM_SRGB,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BGRX8_TYPELESS,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BGRX8_UNORM_SRGB,false,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC6H_TYPELESS,local_39a,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC6H_UF16,local_39a,BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC6H_SF16,local_39a,BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC7_TYPELESS,local_39a,BIND_NONE,false);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC7_UNORM,local_39a,BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_BC7_UNORM_SRGB,local_39a,BIND_SHADER_RESOURCE,true)
  ;
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_ETC2_RGB8_UNORM,
             (bool)(CheckBindFlagSupport.this._6_1_ & 1),BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_ETC2_RGB8_UNORM_SRGB,
             (bool)(CheckBindFlagSupport.this._6_1_ & 1),BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_ETC2_RGB8A1_UNORM,
             (bool)(CheckBindFlagSupport.this._6_1_ & 1),BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB,
             (bool)(CheckBindFlagSupport.this._6_1_ & 1),BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_ETC2_RGBA8_UNORM,
             (bool)(CheckBindFlagSupport.this._6_1_ & 1),BIND_SHADER_RESOURCE,true);
  FlagSupportedTexFormats::anon_class_8_1_8991fb9c::operator()
            (&stack0xfffffffffffffdf8,TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB,
             (bool)(CheckBindFlagSupport.this._6_1_ & 1),BIND_SHADER_RESOURCE,true);
  local_439 = false;
  if (pRStack_18->Type == RENDER_DEVICE_TYPE_GL) {
    pVVar13 = &pRStack_18->APIVersion;
    Version::Version((Version *)&MaxTexelSize,4,3);
    local_439 = Version::operator>=(pVVar13,(Version *)&MaxTexelSize);
  }
  local_209 = local_439;
  local_218[0] = '\b';
  local_218[1] = '\0';
  local_218[2] = '\0';
  local_218[3] = '\0';
  ZeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x10;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range1 + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238,0x400,
             (allocator<unsigned_char> *)((long)&__range1 + 7));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range1 + 7));
  this_00 = &(this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo;
  __end1 = std::
           vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
           ::begin(this_00);
  FmtInfo = (TextureFormatInfoExt *)
            std::
            vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ::end(this_00);
  while (bVar8 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Diligent::TextureFormatInfoExt_*,_std::vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>_>
                                     *)&FmtInfo), bVar8) {
    this_01 = __gnu_cxx::
              __normal_iterator<Diligent::TextureFormatInfoExt_*,_std::vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>_>
              ::operator*(&__end1);
    if ((this_01->super_TextureFormatInfo).super_TextureFormatAttribs.Format != TEX_FORMAT_UNKNOWN)
    {
      msg.field_2._12_4_ =
           TexFormatToGLInternalTexFormat
                     ((this_01->super_TextureFormatInfo).super_TextureFormatAttribs.Format,0);
      if (msg.field_2._12_4_ == 0) {
        if (((this_01->super_TextureFormatInfo).Supported & 1U) != 0) {
          FormatString<char[39]>
                    ((string *)&err,(char (*) [39])"Format should be marked as unsupported");
          pCVar14 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar14,"FlagSupportedTexFormats",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                     ,0x549);
          std::__cxx11::string::~string((string *)&err);
        }
      }
      else {
        if ((local_209 & 1U) != 0) {
          msg_1.field_2._12_4_ = 0;
          (*__glewGetInternalformativ)
                    (0xde1,msg.field_2._12_4_,0x826f,1,(GLint *)(msg_1.field_2._M_local_buf + 0xc));
          msg_1.field_2._8_4_ = glGetError();
          if (msg_1.field_2._8_4_ != 0) {
            LogError<false,char[31],char[17],unsigned_int>
                      (false,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x553,(char (*) [31])"glGetInternalformativ() failed",
                       (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
            FormatString<char[6]>((string *)((long)&msg_2.field_2 + 8),(char (*) [6])0xe8e72e);
            pCVar14 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar14,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x553);
            std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
          }
          if ((bool)((this_01->super_TextureFormatInfo).Supported & 1U) !=
              (msg_1.field_2._12_4_ == 1)) {
            FormatString<char[41]>
                      ((string *)&TestGLTex.m_CreateReleaseHelper,
                       (char (*) [41])"This internal format should be supported");
            pCVar14 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar14,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x554);
            std::__cxx11::string::~string((string *)&TestGLTex.m_CreateReleaseHelper);
          }
        }
        if (((((this_01->super_TextureFormatInfo).Supported & 1U) != 0) &&
            (bVar8 = TextureFormatAttribs::IsDepthStencil((TextureFormatAttribs *)this_01), !bVar8))
           && (((this_01->super_TextureFormatInfo).super_TextureFormatAttribs.IsTypeless & 1U) == 0)
           ) {
          GLObjectWrappers::GLTextureCreateReleaseHelper::GLTextureCreateReleaseHelper(&local_2e0,0)
          ;
          GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::
          GLObjWrapper((GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> *)&err_1,true,
                       local_2e0);
          GVar11 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                             ((GLObjWrapper *)&err_1);
          glBindTexture(0xde1,GVar11);
          msg_3.field_2._12_4_ = glGetError();
          if (msg_3.field_2._12_4_ != 0) {
            LogError<false,char[23],char[17],unsigned_int>
                      (false,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x560,(char (*) [23])"Failed to bind texture",
                       (char (*) [17])"\nGL Error Code: ",(uint *)(msg_3.field_2._M_local_buf + 0xc)
                      );
            FormatString<char[6]>((string *)&TransferAttribs,(char (*) [6])0xe8e72e);
            pCVar14 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar14,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x560);
            std::__cxx11::string::~string((string *)&TransferAttribs);
          }
          (*__glewTexStorage2D)(0xde1,1,msg.field_2._12_4_,8,8);
          iVar12 = glGetError();
          if (iVar12 == 0) {
            NVar18 = GetNativePixelTransferAttribs
                               ((this_01->super_TextureFormatInfo).super_TextureFormatAttribs.Format
                               );
            uVar15 = NVar18._0_8_;
            local_314 = NVar18.IsCompressed;
            local_310 = &local_31c;
            local_31c = uVar15;
            if (((undefined1  [12])NVar18 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
              local_31c._4_4_ = NVar18.DataType;
              GVar6 = local_31c._4_4_;
              in_stack_fffffffffffffb38 =
                   (char (*) [106])
                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
              glTexSubImage2D(0xde1,0,0,0,8,8,uVar15 & 0xffffffff,GVar6);
            }
            else {
              pTVar16 = GetTextureFormatAttribs
                                  ((this_01->super_TextureFormatInfo).super_TextureFormatAttribs.
                                   Format);
              uVar7 = msg.field_2._12_4_;
              p_Var5 = __glewCompressedTexSubImage2D;
              bVar1 = pTVar16->BlockWidth;
              bVar2 = pTVar16->ComponentSize;
              bVar3 = pTVar16->BlockHeight;
              in_stack_fffffffffffffb38 =
                   (char (*) [106])
                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
              (*p_Var5)(0xde1,0,0,0,8,8,uVar7,(8 / bVar3) * (8 / bVar1) * (uint)bVar2,
                        in_stack_fffffffffffffb38);
            }
            iVar12 = glGetError();
            if (iVar12 != 0) {
              FormatString<char[33],int,char[2],int,char[2],char_const*,char[106]>
                        ((string *)((long)&_msg_1.field_2 + 8),
                         (Diligent *)"Failed to upload data to a test ",(char (*) [33])local_218,
                         (int *)0xf64b78,(char (*) [2])local_218,(int *)0xf43b35,
                         (char (*) [2])this_01,
                         (char **)
                         " texture. This likely indicates that the format is not supported despite being reported so by the device."
                         ,in_stack_fffffffffffffb38);
              puVar4 = DebugMessageCallback;
              if (DebugMessageCallback != (undefined *)0x0) {
                uVar17 = std::__cxx11::string::c_str();
                (*(code *)puVar4)(1,uVar17,0);
              }
              std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
              (this_01->super_TextureFormatInfo).Supported = false;
            }
          }
          else {
            FormatString<char[39],int,char[2],int,char[2],char_const*,char[106]>
                      ((string *)local_380,(Diligent *)"Failed to allocate storage for a test ",
                       (char (*) [39])local_218,(int *)0xf64b78,(char (*) [2])local_218,
                       (int *)0xf43b35,(char (*) [2])this_01,
                       (char **)
                       " texture. This likely indicates that the format is not supported despite being reported so by the device."
                       ,in_stack_fffffffffffffb38);
            puVar4 = DebugMessageCallback;
            if (DebugMessageCallback != (undefined *)0x0) {
              uVar17 = std::__cxx11::string::c_str();
              (*(code *)puVar4)(1,uVar17,0);
            }
            std::__cxx11::string::~string((string *)local_380);
            (this_01->super_TextureFormatInfo).Supported = false;
          }
          glBindTexture(0xde1,0);
          GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::
          ~GLObjWrapper((GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> *)&err_1);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<Diligent::TextureFormatInfoExt_*,_std::vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>_>
    ::operator++(&__end1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
  return;
}

Assistant:

void RenderDeviceGLImpl::FlagSupportedTexFormats()
{
    const auto& DeviceInfo     = GetDeviceInfo();
    const auto  bDekstopGL     = DeviceInfo.Type == RENDER_DEVICE_TYPE_GL;
    const auto  bGLES30OrAbove = DeviceInfo.Type == RENDER_DEVICE_TYPE_GLES && DeviceInfo.APIVersion >= Version{3, 0};

    const bool bRGTC       = CheckExtension("GL_EXT_texture_compression_rgtc") || CheckExtension("GL_ARB_texture_compression_rgtc");
    const bool bBPTC       = CheckExtension("GL_EXT_texture_compression_bptc") || CheckExtension("GL_ARB_texture_compression_bptc");
    const bool bS3TC       = CheckExtension("GL_EXT_texture_compression_s3tc") || CheckExtension("GL_WEBGL_compressed_texture_s3tc");
    const bool bTexNorm16  = bDekstopGL || CheckExtension("GL_EXT_texture_norm16"); // Only for ES3.1+
    const bool bTexSwizzle = bDekstopGL || bGLES30OrAbove || CheckExtension("GL_ARB_texture_swizzle");

#if PLATFORM_WEB
    const bool bETC2 = CheckExtension("GL_WEBGL_compressed_texture_etc");
#else
    const bool bETC2 = bGLES30OrAbove || CheckExtension("GL_ARB_ES3_compatibility");
#endif

    //              ||   GLES3.0   ||            GLES3.1              ||            GLES3.2              ||
    // |   Format   ||  CR  |  TF  ||  CR  |  TF  | Req RB | Req. Tex ||  CR  |  TF  | Req RB | Req. Tex ||
    // |------------||------|------||------|------|--------|----------||------|------|--------|----------||
    // |     U8     ||  V   |  V   ||  V   |  V   |   V    |    V     ||  V   |  V   |   V    |    V     ||
    // |     S8     ||      |  V   ||      |  V   |        |    V     ||      |  V   |        |    V     ||
    // |  SRGBA8    ||  V   |  V   ||  V   |  V   |   V    |    V     ||  V   |  V   |   V    |    V     ||
    // |    UI8     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |    SI8     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |    U16     ||  -   |  -   ||  -   |  -   |   -    |    -     ||  -   |  -   |   -    |    -     ||
    // |    S16     ||  -   |  -   ||  -   |  -   |   -    |    -     ||  -   |  -   |   -    |    -     ||
    // |   UI16     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |   SI16     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |   UI32     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |   SI32     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |    F16     ||      |  V   ||      |  V   |        |    V     || +V   |  V   |  +V    |    V     ||
    // |    F32     ||      |      ||      |      |        |    V     || +V   |      |  +V    |    V     ||
    // |  RGB10A2   ||  V   |  V   ||  V   |  V   |   V    |    V     ||  V   |  V   |   V    |    V     ||
    // | RGB10A2UI  ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // | R11G11B10F ||      |  V   ||      |  V   |        |    V     || +V   |  V   |   V    |    V     ||
    // |  RGB9_E5   ||      |      ||      |  V   |        |    V     ||      |  V   |        |    V     ||

    // CR (Color Renderable)          - texture can be used as color attachment
    // TF (Texture Filterable)        - texture can be filtered (mipmapping and minification/magnification filtering)
    // Req RB (Required Renderbuffer) - texture supports renderbuffer usage
    // Req. Tex (Required Texture)    - texture usage is supported

    static constexpr Version NotAvaiable = Version{~0u, ~0u};

    auto CheckBindFlagSupport = [&](BIND_FLAGS                     BindFlag,
                                    const Version&                 MinGLVersion,
                                    const Version&                 MinGLESVersion = Version{~0u, ~0u},
                                    const std::vector<const char*> Extensions     = {}) {
        if (DeviceInfo.Type == RENDER_DEVICE_TYPE_GL && DeviceInfo.APIVersion >= MinGLVersion)
            return BindFlag;

        if (DeviceInfo.Type == RENDER_DEVICE_TYPE_GLES && DeviceInfo.APIVersion >= MinGLESVersion)
            return BindFlag;

        for (const auto* Ext : Extensions)
        {
            if (CheckExtension(Ext))
                return BindFlag;
        }

        return BIND_NONE;
    };

    const BIND_FLAGS TexBindFlags =
        BIND_SHADER_RESOURCE |
        (m_DeviceInfo.Features.PixelUAVWritesAndAtomics ? BIND_UNORDERED_ACCESS : BIND_NONE);

    BIND_FLAGS U8BindFlags         = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SRGBA8BindFlags     = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS S8BindFlags         = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 4}, NotAvaiable, {"GL_EXT_render_snorm"});
    BIND_FLAGS UI8BindFlags        = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SI8BindFlags        = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS U16BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, NotAvaiable, {"GL_EXT_texture_norm16"});
    BIND_FLAGS S16BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 4}, NotAvaiable, {"GL_EXT_render_snorm"});
    BIND_FLAGS UI16BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SI16BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS UI32BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SI32BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS F16BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, {3, 2}, {"GL_EXT_color_buffer_half_float"});
    BIND_FLAGS F32BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, {3, 2}, {"GL_EXT_color_buffer_float"});
    BIND_FLAGS R11G11B10FBindFlags = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, {3, 2});
    BIND_FLAGS BindSrvRtvUav       = TexBindFlags | BIND_RENDER_TARGET;

    auto FlagFormat = [this](TEXTURE_FORMAT Fmt, bool Supported, BIND_FLAGS BindFlags = BIND_NONE, bool Filterable = false) {
        TextureFormatInfoExt& FmtInfo = m_TextureFormatsInfo[Fmt];

        FmtInfo.Supported  = Supported;
        FmtInfo.BindFlags  = Supported ? BindFlags : BIND_NONE;
        FmtInfo.Filterable = Supported && Filterable;
    };

    // The formats marked by true below are required in GL 3.3+ and GLES 3.0+
    // Note that GLES2.0 does not specify any required formats

    // clang-format off
    //               Format                           Supported     BindFlags       Filterable
    FlagFormat(TEX_FORMAT_RGBA32_TYPELESS,            true                                      );
    FlagFormat(TEX_FORMAT_RGBA32_FLOAT,               true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_RGBA32_UINT,                true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGBA32_SINT,                true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGB32_TYPELESS,             true                                      );
    FlagFormat(TEX_FORMAT_RGB32_FLOAT,                true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_RGB32_SINT,                 true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGB32_UINT,                 true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGBA16_TYPELESS,            true                                      );
    FlagFormat(TEX_FORMAT_RGBA16_FLOAT,               true,         F16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RGBA16_UNORM,               bTexNorm16,   U16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RGBA16_UINT,                true,         UI16BindFlags               );
    FlagFormat(TEX_FORMAT_RGBA16_SNORM,               bTexNorm16,   S16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RGBA16_SINT,                true,         SI16BindFlags               );
    FlagFormat(TEX_FORMAT_RG32_TYPELESS,              true                                      );
    FlagFormat(TEX_FORMAT_RG32_FLOAT,                 true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_RG32_SINT,                  true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_RG32_UINT,                  true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_R32G8X24_TYPELESS,          true                                      );
    FlagFormat(TEX_FORMAT_D32_FLOAT_S8X24_UINT,       true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS,   true,         TexBindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_X32_TYPELESS_G8X24_UINT,    false                                     );
    FlagFormat(TEX_FORMAT_RGB10A2_TYPELESS,           true                                      );
    FlagFormat(TEX_FORMAT_RGB10A2_UNORM,              true,         BindSrvRtvUav,          true);
    FlagFormat(TEX_FORMAT_RGB10A2_UINT,               true,         BindSrvRtvUav               );
    FlagFormat(TEX_FORMAT_R11G11B10_FLOAT,            true,         R11G11B10FBindFlags,    true);
    FlagFormat(TEX_FORMAT_RGBA8_TYPELESS,             true                                      );
    FlagFormat(TEX_FORMAT_RGBA8_UNORM,                true,         U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RGBA8_UNORM_SRGB,           true,         SRGBA8BindFlags,        true);
    FlagFormat(TEX_FORMAT_RGBA8_UINT,                 true,         UI8BindFlags                );
    FlagFormat(TEX_FORMAT_RGBA8_SNORM,                true,         S8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RGBA8_SINT,                 true,         SI8BindFlags                );
    FlagFormat(TEX_FORMAT_RG16_TYPELESS,              true                                      );
    FlagFormat(TEX_FORMAT_RG16_FLOAT,                 true,         F16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RG16_UNORM,                 bTexNorm16,   U16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RG16_UINT,                  true,         UI16BindFlags               );
    FlagFormat(TEX_FORMAT_RG16_SNORM,                 bTexNorm16,   S16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RG16_SINT,                  true,         SI16BindFlags               );
    FlagFormat(TEX_FORMAT_R32_TYPELESS,               true                                      );
    FlagFormat(TEX_FORMAT_D32_FLOAT,                  true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R32_FLOAT,                  true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_R32_UINT,                   true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_R32_SINT,                   true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_R24G8_TYPELESS,             true                                      );
    FlagFormat(TEX_FORMAT_D24_UNORM_S8_UINT,          true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R24_UNORM_X8_TYPELESS,      true,         TexBindFlags,           true);
    FlagFormat(TEX_FORMAT_X24_TYPELESS_G8_UINT,       false                                     );
    FlagFormat(TEX_FORMAT_RG8_TYPELESS,               true                                      );
    FlagFormat(TEX_FORMAT_RG8_UNORM,                  true,         U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RG8_UINT,                   true,         UI8BindFlags                );
    FlagFormat(TEX_FORMAT_RG8_SNORM,                  true,         S8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RG8_SINT,                   true,         SI8BindFlags                );
    FlagFormat(TEX_FORMAT_R16_TYPELESS,               true                                      );
    FlagFormat(TEX_FORMAT_R16_FLOAT,                  true,         F16BindFlags,           true);
    FlagFormat(TEX_FORMAT_D16_UNORM,                  true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R16_UNORM,                  bTexNorm16,   U16BindFlags,           true);
    FlagFormat(TEX_FORMAT_R16_UINT,                   true,         UI16BindFlags               );
    FlagFormat(TEX_FORMAT_R16_SNORM,                  bTexNorm16,   S16BindFlags,           true);
    FlagFormat(TEX_FORMAT_R16_SINT,                   true,         SI16BindFlags               );
    FlagFormat(TEX_FORMAT_R8_TYPELESS,                true                                      );
    FlagFormat(TEX_FORMAT_R8_UNORM,                   true,         U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_R8_UINT,                    true,         UI8BindFlags                );
    FlagFormat(TEX_FORMAT_R8_SNORM,                   true,         S8BindFlags,            true);
    FlagFormat(TEX_FORMAT_R8_SINT,                    true,         SI8BindFlags                );
    FlagFormat(TEX_FORMAT_A8_UNORM,                   bTexSwizzle,  U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_R1_UNORM,                   false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_RGB9E5_SHAREDEXP,           true,         BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_RG8_B8G8_UNORM,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_G8R8_G8B8_UNORM,            false                                     ); // Not supported in OpenGL

    FlagFormat(TEX_FORMAT_BC1_TYPELESS,               bS3TC                                     );
    FlagFormat(TEX_FORMAT_BC1_UNORM,                  bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC1_UNORM_SRGB,             bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC2_TYPELESS,               bS3TC                                     );
    FlagFormat(TEX_FORMAT_BC2_UNORM,                  bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC2_UNORM_SRGB,             bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC3_TYPELESS,               bS3TC                                     );
    FlagFormat(TEX_FORMAT_BC3_UNORM,                  bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC3_UNORM_SRGB,             bS3TC,        BIND_SHADER_RESOURCE,   true);

    FlagFormat(TEX_FORMAT_BC4_TYPELESS,               bRGTC                                     );
    FlagFormat(TEX_FORMAT_BC4_UNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC4_SNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC5_TYPELESS,               bRGTC                                     );
    FlagFormat(TEX_FORMAT_BC5_UNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC5_SNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);

    FlagFormat(TEX_FORMAT_B5G6R5_UNORM,               false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_B5G5R5A1_UNORM,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRA8_UNORM,                bTexSwizzle,  BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BGRX8_UNORM,                false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM, false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRA8_TYPELESS,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRA8_UNORM_SRGB,           false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRX8_TYPELESS,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRX8_UNORM_SRGB,           false                                     ); // Not supported in OpenGL

    FlagFormat(TEX_FORMAT_BC6H_TYPELESS,              bBPTC);
    FlagFormat(TEX_FORMAT_BC6H_UF16,                  bBPTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC6H_SF16,                  bBPTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC7_TYPELESS,               bBPTC);
    FlagFormat(TEX_FORMAT_BC7_UNORM,                  bBPTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC7_UNORM_SRGB,             bBPTC,        BIND_SHADER_RESOURCE,   true);

    FlagFormat(TEX_FORMAT_ETC2_RGB8_UNORM,            bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGB8_UNORM_SRGB,       bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGB8A1_UNORM,          bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB,     bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGBA8_UNORM,           bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB,      bETC2,        BIND_SHADER_RESOURCE,   true);
    // clang-format on

#ifdef DILIGENT_DEVELOPMENT
    const bool bGL43OrAbove = DeviceInfo.Type == RENDER_DEVICE_TYPE_GL && DeviceInfo.APIVersion >= Version{4, 3};

    constexpr int      TestTextureDim = 8;
    constexpr int      MaxTexelSize   = 16;
    std::vector<Uint8> ZeroData(TestTextureDim * TestTextureDim * MaxTexelSize);

    // Go through all formats and try to create small 2D texture to check if the format is supported
    for (auto& FmtInfo : m_TextureFormatsInfo)
    {
        if (FmtInfo.Format == TEX_FORMAT_UNKNOWN)
            continue;

        auto GLFmt = TexFormatToGLInternalTexFormat(FmtInfo.Format);
        if (GLFmt == 0)
        {
            VERIFY(!FmtInfo.Supported, "Format should be marked as unsupported");
            continue;
        }

#    if GL_ARB_internalformat_query2
        // Only works on GL4.3+
        if (bGL43OrAbove)
        {
            GLint params = 0;
            glGetInternalformativ(GL_TEXTURE_2D, GLFmt, GL_INTERNALFORMAT_SUPPORTED, 1, &params);
            CHECK_GL_ERROR("glGetInternalformativ() failed");
            VERIFY(FmtInfo.Supported == (params == GL_TRUE), "This internal format should be supported");
        }
#    else
        (void)bGL43OrAbove; // To suppress warning
#    endif

        // Check that the format is indeed supported
        if (FmtInfo.Supported && !FmtInfo.IsDepthStencil() && !FmtInfo.IsTypeless)
        {
            GLObjectWrappers::GLTextureObj TestGLTex{true};
            // Immediate context has not been created yet, so use raw GL functions
            glBindTexture(GL_TEXTURE_2D, TestGLTex);
            CHECK_GL_ERROR("Failed to bind texture");
            glTexStorage2D(GL_TEXTURE_2D, 1, GLFmt, TestTextureDim, TestTextureDim);
            if (glGetError() == GL_NO_ERROR)
            {
                // It turned out it is not enough to only allocate texture storage
                // For some reason glTexStorage2D() may succeed, but upload operation
                // will later fail. So we need to additionally try to upload some
                // data to the texture
                const auto& TransferAttribs = GetNativePixelTransferAttribs(FmtInfo.Format);
                if (TransferAttribs.IsCompressed)
                {
                    const auto& FmtAttribs = GetTextureFormatAttribs(FmtInfo.Format);
                    static_assert((TestTextureDim & (TestTextureDim - 1)) == 0, "Test texture dim must be power of two!");
                    auto BlockBytesInRow = (TestTextureDim / int{FmtAttribs.BlockWidth}) * int{FmtAttribs.ComponentSize};
                    glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, // mip level
                                              0, 0, TestTextureDim, TestTextureDim,
                                              GLFmt,
                                              (TestTextureDim / int{FmtAttribs.BlockHeight}) * BlockBytesInRow,
                                              ZeroData.data());
                }
                else
                {
                    glTexSubImage2D(GL_TEXTURE_2D, 0, // mip level
                                    0, 0, TestTextureDim, TestTextureDim,
                                    TransferAttribs.PixelFormat, TransferAttribs.DataType,
                                    ZeroData.data());
                }

                if (glGetError() != GL_NO_ERROR)
                {
                    LOG_WARNING_MESSAGE("Failed to upload data to a test ", TestTextureDim, "x", TestTextureDim, " ", FmtInfo.Name,
                                        " texture. This likely indicates that the format is not supported despite being reported so by the device.");
                    FmtInfo.Supported = false;
                }
            }
            else
            {
                LOG_WARNING_MESSAGE("Failed to allocate storage for a test ", TestTextureDim, "x", TestTextureDim, " ", FmtInfo.Name,
                                    " texture. This likely indicates that the format is not supported despite being reported so by the device.");
                FmtInfo.Supported = false;
            }
            glBindTexture(GL_TEXTURE_2D, 0);
        }
    }
#endif
}